

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

size_t mtbdd_set_count(MTBDD set)

{
  size_t result;
  
  do {
    set = mtbdd_gethigh(set);
  } while( true );
}

Assistant:

size_t
mtbdd_set_count(MTBDD set)
{
    size_t result = 0;
    while (set != mtbdd_true) {
        result++;
        set = mtbdd_gethigh(set);
    }
    return result;
}